

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O0

compile_errcode __thiscall ReturnStatement::Parse(ReturnStatement *this)

{
  LogTools *pLVar1;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  SymbolName local_24;
  int local_20;
  SymbolName name;
  int state;
  int ret;
  ReturnStatement *this_local;
  
  name = WHILE_SYM;
  local_20 = 0;
  _state = this;
  do {
    local_24 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    pLVar1 = g_log_tools;
    switch(local_20) {
    case 0:
      if (local_24 != RETURN_SYM) {
        return -1;
      }
      local_20 = 1;
      break;
    case 1:
      if (local_24 != L_CIRCLE_BRACKET_SYM) {
        if (local_24 == SEMICOLON_SYM) {
          return 0;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_48,"expected a \'(\' or \';\'",&local_49);
        GrammaErrorLogs(pLVar1,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        return -1;
      }
      local_20 = 2;
      break;
    case 2:
      name = Expression::Parse(&this->m_expression);
      pLVar1 = g_log_tools;
      if (name != WHILE_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_80,"expected a valid expression in return statement",&local_81);
        GrammaErrorLogs(pLVar1,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        return -1;
      }
      local_20 = 3;
      Expression::LogOutput(&this->m_expression);
      break;
    case 3:
      if (local_24 != R_CIRCLE_BRACKET_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,"expected a \')\'",&local_a9);
        GrammaErrorLogs(pLVar1,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        return -1;
      }
      local_20 = 4;
      break;
    case 4:
      return 0;
    }
    if (local_20 != 3) {
      SymbolQueue::NextSymbol(handle_symbol_queue);
    }
  } while( true );
}

Assistant:

compile_errcode ReturnStatement::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == RETURN_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    return COMPILE_OK;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '(' or ';'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    state = 3;
                    m_expression.LogOutput();
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid expression in return statement");
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}